

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NetworkBroker_impl.hpp
# Opt level: O0

string * __thiscall
helics::NetworkBroker<helics::inproc::InprocComms,(gmlc::networking::InterfaceTypes)4,18>::
generateLocalAddressString_abi_cxx11_
          (NetworkBroker<helics::inproc::InprocComms,_(gmlc::networking::InterfaceTypes)4,_18> *this
          )

{
  bool bVar1;
  string *__str;
  CoreBroker *in_RSI;
  CommsInterface *in_RDI;
  lock_guard<std::mutex> lock;
  string *add;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff88;
  CommsInterface *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffd8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffe0;
  
  this_00 = in_RDI;
  std::__cxx11::string::string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)in_RSI);
  CLI::std::
  unique_ptr<helics::inproc::InprocComms,_std::default_delete<helics::inproc::InprocComms>_>::
  operator->((unique_ptr<helics::inproc::InprocComms,_std::default_delete<helics::inproc::InprocComms>_>
              *)0x3c2cc0);
  bVar1 = CommsInterface::isConnected(this_00);
  if (bVar1) {
    CLI::std::
    unique_ptr<helics::inproc::InprocComms,_std::default_delete<helics::inproc::InprocComms>_>::
    operator->((unique_ptr<helics::inproc::InprocComms,_std::default_delete<helics::inproc::InprocComms>_>
                *)0x3c2ce9);
    inproc::InprocComms::getAddress_abi_cxx11_((InprocComms *)in_stack_ffffffffffffff88);
    CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
              (in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_00);
  }
  else {
    std::lock_guard<std::mutex>::lock_guard
              ((lock_guard<std::mutex> *)this_00,(mutex_type *)in_stack_ffffffffffffff88);
    bVar1 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
            empty((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x3c2d56);
    if (bVar1) {
      __str = CoreBroker::getIdentifier_abi_cxx11_(in_RSI);
      CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
      operator=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_00,
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__str);
    }
    else {
      CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
      operator=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_00,
                in_stack_ffffffffffffff88);
    }
    std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)0x3c2dba);
  }
  return (string *)in_RDI;
}

Assistant:

std::string NetworkBroker<COMMS, baseline, tcode>::generateLocalAddressString() const
{
    using InterfaceTypes = gmlc::networking::InterfaceTypes;
    std::string add;
    if (CommsBroker<COMMS, CoreBroker>::comms->isConnected()) {
        add = CommsBroker<COMMS, CoreBroker>::comms->getAddress();
    } else {
        std::lock_guard<std::mutex> lock(dataMutex);
        switch (baseline) {
            case InterfaceTypes::TCP:
            case InterfaceTypes::IP:
            case InterfaceTypes::UDP:
                if (!netInfo.localInterface.empty() && (netInfo.localInterface.back() == '*')) {
                    add = gmlc::networking::makePortAddress(
                        netInfo.localInterface.substr(0, netInfo.localInterface.size() - 1),
                        netInfo.portNumber);
                } else {
                    add = gmlc::networking::makePortAddress(netInfo.localInterface,
                                                            netInfo.portNumber);
                }
                break;
            case InterfaceTypes::INPROC:
            case InterfaceTypes::IPC:
            default:
                if (!netInfo.localInterface.empty()) {
                    add = netInfo.localInterface;
                } else {
                    add = CoreBroker::getIdentifier();
                }
                break;
        }
    }
    return add;
}